

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

void __thiscall DropdownMenu::DropdownMenu(DropdownMenu *this)

{
  undefined8 *in_RDI;
  Vector2f *size;
  RectangleShape *in_stack_ffffffffffffffe0;
  TextButton *in_stack_fffffffffffffff0;
  
  UIComponent::UIComponent((UIComponent *)in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__DropdownMenu_002bc1b8;
  in_RDI[1] = &PTR__DropdownMenu_002bc1f0;
  size = (Vector2f *)(in_RDI + 0x17);
  TextButton::TextButton(in_stack_fffffffffffffff0);
  sf::Vector2<float>::Vector2((Vector2<float> *)&stack0xffffffffffffffe4,0.0,0.0);
  sf::RectangleShape::RectangleShape(in_stack_ffffffffffffffe0,size);
  std::vector<TextButton,_std::allocator<TextButton>_>::vector
            ((vector<TextButton,_std::allocator<TextButton>_> *)0x1a7e87);
  return;
}

Assistant:

DropdownMenu::DropdownMenu() {}